

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::reversefind(CBString *this,char c,int pos)

{
  int local_20;
  int pos_local;
  char c_local;
  CBString *this_local;
  
  if (pos <= (this->super_tagbstring).slen) {
    local_20 = pos;
    if (pos == (this->super_tagbstring).slen) {
      local_20 = pos + -1;
    }
    for (; -1 < local_20; local_20 = local_20 + -1) {
      if ((this->super_tagbstring).data[local_20] == c) {
        return local_20;
      }
    }
  }
  return -1;
}

Assistant:

int CBString::reversefind (char c, int pos) const {
	if (pos > slen) return BSTR_ERR;
	if (pos == slen) pos--;
	for (;pos >= 0; pos--) {
		if (data[pos] == (unsigned char) c) return pos;
	}
	return BSTR_ERR;
}